

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CNullDriver.cpp
# Opt level: O1

void __thiscall
irr::video::CNullDriver::draw2DImage
          (CNullDriver *this,ITexture *texture,vector2d<int> *destPos,bool useAlphaChannelOfTexture)

{
  if (texture != (ITexture *)0x0) {
    (*(this->super_IVideoDriver)._vptr_IVideoDriver[0x30])();
  }
  return;
}

Assistant:

void CNullDriver::draw2DImage(const video::ITexture *texture, const core::position2d<s32> &destPos, bool useAlphaChannelOfTexture)
{
	if (!texture)
		return;

	draw2DImage(texture, destPos, core::rect<s32>(core::position2d<s32>(0, 0), core::dimension2di(texture->getOriginalSize())),
			0,
			SColor(255, 255, 255, 255),
			useAlphaChannelOfTexture);
}